

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void find_headers(path *dir,
                 vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 *headers)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer pbVar2;
  pointer pbVar3;
  path *__p;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_c1;
  recursive_directory_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  HDR_EXT;
  path file;
  path local_58;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file,".h",(allocator<char> *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file._M_cmpts,".hpp",(allocator<char> *)&it);
  __l._M_len = 2;
  __l._M_array = &file._M_pathname;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&HDR_EXT,__l,&local_c1);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&file._M_pathname._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator(&it,dir);
  while( true ) {
    _Var1._M_pi = it._M_dirs._M_refcount._M_pi;
    file._M_pathname._M_dataplus._M_p = (pointer)0x0;
    file._M_pathname._M_string_length = 0;
    std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
              ((recursive_directory_iterator *)&file);
    if (_Var1._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    __p = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&it);
    std::filesystem::__cxx11::path::path(&file,__p);
    pbVar3 = HDR_EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = HDR_EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::filesystem::__cxx11::path::extension(&local_58,&file);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::filesystem::__cxx11::path_const>>
                      (pbVar2,pbVar3,&local_58);
    pbVar2 = HDR_EXT.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::filesystem::__cxx11::path::~path(&local_58);
    if (_Var4._M_current != pbVar2) {
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      push_back(headers,&file);
    }
    std::filesystem::__cxx11::path::~path(&file);
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&it);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&HDR_EXT);
  return;
}

Assistant:

void find_headers(fs::path dir, std::vector<fs::path> &headers) {
  const std::vector<std::string> HDR_EXT = {".h", ".hpp"};
  for (fs::recursive_directory_iterator it(dir);
       it != fs::recursive_directory_iterator(); ++it) {
    fs::path file = it->path();
    if (std::find(HDR_EXT.begin(), HDR_EXT.end(), file.extension()) !=
        HDR_EXT.end()) {
      headers.push_back(file);
    }
  }
}